

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O1

bool __thiscall soplex::NameSet::isConsistent(NameSet *this)

{
  return true;
}

Assistant:

bool NameSet::isConsistent() const
{
#ifdef ENABLE_CONSISTENCY_CHECKS

   if(memused > memmax)
      return SPX_MSG_INCONSISTENT("NameSet");

   int i;

   for(i = 0; i < num(); i++)
   {
      const char* t = &mem[set[i]];

      if(!has(t))
         return SPX_MSG_INCONSISTENT("NameSet");

      if(strcmp(t, operator[](key(t))))
         return SPX_MSG_INCONSISTENT("NameSet");
   }

   return set.isConsistent() && hashtab.isConsistent();
#else
   return true;
#endif
}